

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O3

bool __thiscall google::protobuf::MapKey::GetBoolValue(MapKey *this)

{
  char *__s;
  CppType CVar1;
  size_t sVar2;
  LogMessage *this_00;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view v;
  string_view str_03;
  string_view str_04;
  string_view v_00;
  LogMessage LStack_28;
  
  CVar1 = type(this);
  if (CVar1 == CPPTYPE_BOOL) {
    return (this->val_).bool_value;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.h"
             ,0x83);
  str._M_str = "Protocol Buffer map usage error:\n";
  str._M_len = 0x21;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_28,str);
  str_00._M_str = "MapKey::GetBoolValue";
  str_00._M_len = 0x14;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
            (&LStack_28,str_00);
  str_01._M_str = " type does not match\n";
  str_01._M_len = 0x15;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
            (&LStack_28,str_01);
  str_02._M_str = "  Expected : ";
  str_02._M_len = 0xd;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
            (&LStack_28,str_02);
  sVar2 = strlen((char *)0x51bb26);
  v._M_str = (char *)0x51bb26;
  v._M_len = sVar2;
  this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_28,v);
  str_03._M_str = "\n";
  str_03._M_len = 1;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,str_03);
  str_04._M_str = "  Actual   : ";
  str_04._M_len = 0xd;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,str_04);
  CVar1 = type(this);
  __s = *(char **)(FieldDescriptor::kCppTypeToName + (ulong)CVar1 * 8);
  sVar2 = strlen(__s);
  v_00._M_str = __s;
  v_00._M_len = sVar2;
  absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,v_00);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_28)
  ;
}

Assistant:

bool GetBoolValue() const {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_BOOL, "MapKey::GetBoolValue");
    return val_.bool_value;
  }